

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasmbox.c
# Opt level: O3

int decode_truncation_inst
              (wasmbox_input_stream_t *ins,wasmbox_module_t *mod,wasmbox_mutable_function_t *func,
              wasm_u8_t op)

{
  byte bVar1;
  int iVar2;
  
  bVar1 = wasmbox_input_stream_read_u8(ins);
  iVar2 = -1;
  if (bVar1 < 8) {
    fwrite(&DAT_0010a630 + *(int *)(&DAT_0010a630 + (ulong)bVar1 * 4),0x14,1,_stdout);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int decode_truncation_inst(wasmbox_input_stream_t *ins,
                                  wasmbox_module_t *mod,
                                  wasmbox_mutable_function_t *func,
                                  wasm_u8_t op) {
  wasm_u8_t op1 = wasmbox_input_stream_read_u8(ins);
  switch (op1) {
#define FUNC(opcode0, opcode1, type, inst, vmopcode) \
  case opcode1: {                                    \
    fprintf(stdout, "" #type "." #inst "\n");        \
    return 0;                                        \
  }
    SATURATING_TRUNCATION_INST_EACH(FUNC)
#undef FUNC
    default:
      return -1;
  }
  return -1;
}